

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filenames.cc
# Opt level: O1

string_view __thiscall wabt::GetBasename(wabt *this,string_view filename)

{
  char *pcVar1;
  wabt *pwVar2;
  wabt *pwVar3;
  wabt *pwVar4;
  char *pcVar5;
  char *extraout_RDX;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  char *pcVar9;
  bool bVar10;
  string_view sVar11;
  string_view sVar12;
  string_view sVar13;
  
  pcVar6 = (char *)filename._M_len;
  pwVar2 = (wabt *)0xffffffffffffffff;
  pwVar4 = this;
  if (this != (wabt *)0x0) {
    do {
      pwVar2 = pwVar4 + -1;
      if (pwVar4 == (wabt *)0x0) {
        pwVar2 = (wabt *)0xffffffffffffffff;
        break;
      }
      pcVar7 = pcVar6 + -1 + (long)pwVar4;
      pwVar4 = pwVar2;
    } while (*pcVar7 != '/');
  }
  pwVar4 = this;
  if (this == (wabt *)0x0) {
LAB_00121b22:
    pwVar3 = (wabt *)0xffffffffffffffff;
  }
  else {
    do {
      pwVar3 = pwVar4 + -1;
      if (pwVar4 == (wabt *)0x0) goto LAB_00121b22;
      pcVar7 = pcVar6 + -1 + (long)pwVar4;
      pwVar4 = pwVar3;
    } while (*pcVar7 != '\\');
  }
  if (((ulong)pwVar3 & (ulong)pwVar2) != 0xffffffffffffffff) {
    if (pwVar2 == (wabt *)0xffffffffffffffff) {
      pwVar4 = pwVar3;
      if (pwVar3 == (wabt *)0xffffffffffffffff) goto LAB_00121b66;
    }
    else {
      pwVar4 = pwVar2;
      if ((pwVar3 != (wabt *)0xffffffffffffffff) && (pwVar4 = pwVar3, pwVar3 < pwVar2)) {
        pwVar4 = pwVar2;
      }
    }
    pwVar4 = pwVar4 + 1;
    bVar10 = this < pwVar4;
    this = this + -(long)pwVar4;
    if (bVar10) {
      pcVar9 = "%s: __pos (which is %zu) > __size (which is %zu)";
      pcVar7 = "basic_string_view::substr";
      std::__throw_out_of_range_fmt("%s: __pos (which is %zu) > __size (which is %zu)");
      pcVar6 = pcVar9;
      if (pcVar9 == (char *)0x0) {
LAB_00121ba0:
        pcVar5 = (char *)0xffffffffffffffff;
      }
      else {
        do {
          pcVar5 = pcVar6 + -1;
          if (pcVar6 == (char *)0x0) goto LAB_00121ba0;
          pcVar1 = pcVar7 + -1 + (long)pcVar6;
          pcVar6 = pcVar5;
        } while (*pcVar1 != '.');
      }
      if (pcVar5 == (char *)0xffffffffffffffff) {
        pcVar7 = "";
        sVar13._M_len = 0;
      }
      else {
        sVar13._M_len = (long)pcVar9 - (long)pcVar5;
        if (pcVar9 < pcVar5) {
          pcVar7 = "%s: __pos (which is %zu) > __size (which is %zu)";
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr")
          ;
          sVar13._M_len = 0;
          pcVar6 = (char *)((ulong)pcVar7 & 0xffffffff);
          do {
            pcVar6 = (char *)((ulong)pcVar6 >> 7);
            sVar13._M_len = sVar13._M_len + 1;
            uVar8 = (uint)pcVar7;
            pcVar7 = pcVar6;
          } while (0x7f < uVar8);
          sVar13._M_str = extraout_RDX;
          return sVar13;
        }
        pcVar7 = pcVar7 + (long)pcVar5;
      }
      sVar12._M_str = pcVar7;
      sVar12._M_len = sVar13._M_len;
      return sVar12;
    }
    pcVar6 = pcVar6 + (long)pwVar4;
  }
LAB_00121b66:
  sVar11._M_str = pcVar6;
  sVar11._M_len = (size_t)this;
  return sVar11;
}

Assistant:

std::string_view GetBasename(std::string_view filename) {
  size_t last_slash = filename.find_last_of('/');
  size_t last_backslash = filename.find_last_of('\\');
  if (last_slash == std::string_view::npos &&
      last_backslash == std::string_view::npos) {
    return filename;
  }

  if (last_slash == std::string_view::npos) {
    if (last_backslash == std::string_view::npos) {
      return filename;
    }
    last_slash = last_backslash;
  } else if (last_backslash != std::string_view::npos) {
    last_slash = std::max(last_slash, last_backslash);
  }

  return filename.substr(last_slash + 1);
}